

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QModelIndex>::growAppend
          (QCommonArrayOps<QModelIndex> *this,QModelIndex *b,QModelIndex *e)

{
  qsizetype *pqVar1;
  QModelIndex *pQVar2;
  QModelIndex *pQVar3;
  quintptr qVar4;
  int iVar5;
  QModelIndex *pQVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_48;
  QModelIndex *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = b;
  if (b != e) {
    lVar8 = (long)e - (long)b;
    lVar7 = (lVar8 >> 3) * -0x5555555555555555;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QModelIndex *)0x0;
    local_48.size = 0;
    pQVar3 = (this->super_Type).super_QGenericArrayOps<QModelIndex>.
             super_QArrayDataPointer<QModelIndex>.ptr;
    if ((b < pQVar3) ||
       (pQVar3 + (this->super_Type).super_QGenericArrayOps<QModelIndex>.
                 super_QArrayDataPointer<QModelIndex>.size <= b)) {
      QArrayDataPointer<QModelIndex>::detachAndGrow
                ((QArrayDataPointer<QModelIndex> *)this,GrowsAtEnd,lVar7,(QModelIndex **)0x0,
                 (QArrayDataPointer<QModelIndex> *)0x0);
    }
    else {
      QArrayDataPointer<QModelIndex>::detachAndGrow
                ((QArrayDataPointer<QModelIndex> *)this,GrowsAtEnd,lVar7,&local_30,&local_48);
    }
    if ((e != b) && (0 < lVar8)) {
      pQVar3 = (this->super_Type).super_QGenericArrayOps<QModelIndex>.
               super_QArrayDataPointer<QModelIndex>.ptr;
      pQVar6 = local_30;
      do {
        lVar7 = (this->super_Type).super_QGenericArrayOps<QModelIndex>.
                super_QArrayDataPointer<QModelIndex>.size;
        pQVar3[lVar7].m.ptr = (pQVar6->m).ptr;
        iVar5 = pQVar6->c;
        qVar4 = pQVar6->i;
        pQVar2 = pQVar3 + lVar7;
        pQVar2->r = pQVar6->r;
        pQVar2->c = iVar5;
        pQVar2->i = qVar4;
        pQVar6 = pQVar6 + 1;
        pqVar1 = &(this->super_Type).super_QGenericArrayOps<QModelIndex>.
                  super_QArrayDataPointer<QModelIndex>.size;
        *pqVar1 = *pqVar1 + 1;
      } while (pQVar6 < (QModelIndex *)(lVar8 + (long)local_30));
    }
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d)->super_QArrayData,0x18,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }